

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O3

void __thiscall CVmObjFileName::load_image_data(CVmObjFileName *this,char *ptr,size_t siz)

{
  ushort uVar1;
  int32_t sfid;
  long lVar2;
  void *pvVar3;
  uint16_t tmp;
  int iVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_00;
  uint16_t tmp_1;
  long *in_FS_OFFSET;
  char sfbuf [4096];
  uint local_1038 [2];
  long local_1030;
  void *local_1028;
  __jmp_buf_tag local_1020 [20];
  CVmObjFileName *pCVar7;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  sfid = *(int32_t *)ptr;
  if (sfid == 0) {
    uVar1 = *(ushort *)(ptr + 4);
    G_err_frame::__tls_init();
    local_1030 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_1038;
    local_1038[0] = _setjmp(local_1020);
    if (local_1038[0] == 0) {
      __s = url_to_local(ptr + 6,(ulong)uVar1,0);
      sVar6 = strlen(__s);
      iVar4 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,sVar6 + 10,this);
      pCVar7 = (CVmObjFileName *)CONCAT44(extraout_var_00,iVar4);
      *(undefined4 *)&(pCVar7->super_CVmObject)._vptr_CVmObject = 0;
      *(undefined2 *)((long)&(pCVar7->super_CVmObject)._vptr_CVmObject + 4) = 1;
      *(short *)((long)&(pCVar7->super_CVmObject)._vptr_CVmObject + 6) = (short)sVar6;
      *(undefined1 *)((long)&(pCVar7->super_CVmObject).ext_ + sVar6) = 0;
      if (__s == (char *)0x0) {
        __s = (char *)0x0;
      }
      else {
        memcpy(&(pCVar7->super_CVmObject).ext_,__s,sVar6);
      }
    }
    else {
      __s = (char *)0x0;
      pCVar7 = this;
    }
    if (-1 < (short)local_1038[0]) {
      local_1038[0] = local_1038[0] | 0x8000;
      lib_free_str(__s);
    }
    lVar2 = local_1030;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar2;
    if ((local_1038[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar3 = local_1028;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_1038[0] & 2) != 0) {
      free(local_1028);
    }
  }
  else {
    iVar4 = CVmObjFile::sfid_to_path((char *)local_1038,0x1000,sfid);
    sVar6 = strlen((char *)local_1038);
    iVar5 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,sVar6 + 10,this);
    pCVar7 = (CVmObjFileName *)CONCAT44(extraout_var,iVar5);
    *(int32_t *)&(pCVar7->super_CVmObject)._vptr_CVmObject = sfid;
    *(undefined2 *)((long)&(pCVar7->super_CVmObject)._vptr_CVmObject + 4) = 1;
    *(short *)((long)&(pCVar7->super_CVmObject)._vptr_CVmObject + 6) = (short)sVar6;
    *(undefined1 *)((long)&(pCVar7->super_CVmObject).ext_ + sVar6) = 0;
    memcpy(&(pCVar7->super_CVmObject).ext_,local_1038,sVar6);
    *(char *)((long)&(pCVar7->super_CVmObject)._vptr_CVmObject + 4) = (char)iVar4;
  }
  (this->super_CVmObject).ext_ = (char *)pCVar7;
  return;
}

Assistant:

void CVmObjFileName::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* get the special file ID */
    int32_t sfid = osrp4s(ptr);

    /* if there's a special file ID, look it up; otherwise load the name */
    vm_filnam_ext *ext;
    if (sfid != 0)
    {
        /* translate the special file ID to a path */
        char sfbuf[OSFNMAX];
        int ok = CVmObjFile::sfid_to_path(vmg_ sfbuf, sizeof(sfbuf), sfid);

        /* allocate the extension */
        ext = vm_filnam_ext::alloc_ext(vmg_ this, sfid, sfbuf, strlen(sfbuf));

        /* note whether the special file ID is valid */
        ext->sfid_valid = (char)ok;
    }
    else
    {
        /* get the filename pointer and length */
        const char *str = ptr + 4;
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        char *lcl = 0;
        err_try
        {
            /* convert the universal path string to local notation */
            lcl = url_to_local(vmg_ str, len, FALSE);

            /* allocate the extension */
            ext = vm_filnam_ext::alloc_ext(vmg_ this, 0, lcl, strlen(lcl));
        }
        err_finally
        {
            lib_free_str(lcl);
        }